

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O2

void EncodeContextMap(MemoryManager *m,uint32_t *context_map,size_t context_map_size,
                     size_t num_clusters,HuffmanTree *tree,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  void *p;
  ulong uVar6;
  size_t sVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  char *__assertion;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint8_t depths [272];
  uint32_t histogram [272];
  uint16_t bits [272];
  
  StoreVarLenUint8(num_clusters - 1,storage_ix,storage);
  if (num_clusters != 1) {
    p = BrotliAllocate(m,context_map_size * 4);
    uVar5 = *context_map;
    for (uVar6 = 1; uVar6 < context_map_size; uVar6 = uVar6 + 1) {
      if (uVar5 < context_map[uVar6]) {
        uVar5 = context_map[uVar6];
      }
    }
    if (0xff < uVar5) {
      __assert_fail("max_value < 256u",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/brotli_bit_stream.c"
                    ,0x26e,
                    "void MoveToFrontTransform(const uint32_t *restrict, const size_t, uint32_t *)")
      ;
    }
    for (uVar6 = 0; uVar5 + 1 != uVar6; uVar6 = uVar6 + 1) {
      *(char *)((long)histogram + uVar6) = (char)uVar6;
    }
    for (sVar7 = 0; sVar7 != context_map_size; sVar7 = sVar7 + 1) {
      uVar4 = context_map[sVar7];
      uVar6 = 0;
      while( true ) {
        if (uVar5 + 1 == uVar6) {
          __assert_fail("index < mtf_size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/brotli_bit_stream.c"
                        ,0x276,
                        "void MoveToFrontTransform(const uint32_t *restrict, const size_t, uint32_t *)"
                       );
        }
        if (*(char *)((long)histogram + uVar6) == (char)uVar4) break;
        uVar6 = uVar6 + 1;
      }
      *(int *)((long)p + sVar7 * 4) = (int)uVar6;
      while (uVar6 != 0) {
        *(uint8_t *)((long)histogram + uVar6) = depths[uVar6 + 0x10f];
        uVar6 = uVar6 - 1;
      }
      histogram[0]._0_1_ = (char)uVar4;
    }
    sVar7 = 0;
    uVar6 = 0;
    while (uVar5 = (uint)uVar6, sVar7 < context_map_size) {
      for (; (uVar13 = context_map_size, context_map_size != sVar7 &&
             (uVar13 = sVar7, *(int *)((long)p + sVar7 * 4) != 0)); sVar7 = sVar7 + 1) {
      }
      sVar7 = context_map_size;
      if (context_map_size < uVar13) {
        sVar7 = uVar13;
      }
      uVar8 = (int)sVar7 - (int)uVar13;
      for (lVar10 = 0; (uVar13 - sVar7) + lVar10 != 0; lVar10 = lVar10 + 1) {
        if (*(int *)((long)p + lVar10 * 4 + uVar13 * 4) != 0) {
          sVar7 = uVar13 + lVar10;
          uVar8 = (uint)lVar10;
          break;
        }
      }
      if (uVar5 < uVar8) {
        uVar6 = (ulong)uVar8;
      }
    }
    uVar8 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    uVar13 = 6;
    if (uVar8 < 6) {
      uVar13 = (ulong)uVar8;
    }
    if (uVar5 == 0) {
      uVar13 = uVar6;
    }
    uVar8 = (uint)uVar13;
    uVar5 = 2 << ((byte)uVar13 & 0x1f);
    uVar6 = 0;
    uVar11 = 0;
LAB_00116339:
    if (uVar11 < context_map_size) {
      if (uVar11 < uVar6) {
        __assert_fail("*out_size <= i",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/brotli_bit_stream.c"
                      ,0x296,
                      "void RunLengthCodeZeros(const size_t, uint32_t *restrict, size_t *restrict, uint32_t *restrict)"
                     );
      }
      iVar2 = *(int *)((long)p + uVar11 * 4);
      if (iVar2 == 0) {
        uVar12 = (int)context_map_size - (int)uVar11;
        for (lVar10 = 1; uVar11 + lVar10 < context_map_size; lVar10 = lVar10 + 1) {
          if (*(int *)((long)p + lVar10 * 4 + uVar11 * 4) != 0) {
            uVar12 = (uint)lVar10;
            break;
          }
        }
        uVar11 = uVar11 + uVar12;
LAB_0011638a:
        if (uVar12 != 0) {
          if (uVar5 <= uVar12) goto code_r0x00116396;
          uVar3 = 0x1f;
          if (uVar12 != 0) {
            for (; uVar12 >> uVar3 == 0; uVar3 = uVar3 - 1) {
            }
          }
          *(uint *)((long)p + uVar6 * 4) = ((-1 << ((byte)uVar3 & 0x1f)) + uVar12) * 0x200 | uVar3;
          goto LAB_001163bc;
        }
        goto LAB_00116339;
      }
      *(uint *)((long)p + uVar6 * 4) = iVar2 + uVar8;
      uVar11 = uVar11 + 1;
LAB_001163bc:
      uVar6 = uVar6 + 1;
      goto LAB_00116339;
    }
    memset(histogram,0,0x440);
    for (uVar11 = 0; uVar6 != uVar11; uVar11 = uVar11 + 1) {
      histogram[*(uint *)((long)p + uVar11 * 4) & 0x1ff] =
           histogram[*(uint *)((long)p + uVar11 * 4) & 0x1ff] + 1;
    }
    uVar9 = *storage_ix;
    uVar11 = uVar9 + 1;
    *(ulong *)(storage + (uVar9 >> 3)) =
         (ulong)(uVar8 != 0) << ((byte)uVar9 & 7) | (ulong)storage[uVar9 >> 3];
    *storage_ix = uVar11;
    if (uVar8 != 0) {
      *(ulong *)(storage + (uVar11 >> 3)) =
           (ulong)(uVar8 - 1) << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
      *storage_ix = uVar9 + 5;
    }
    BuildAndStoreHuffmanTree(histogram,uVar13 + num_clusters,tree,depths,bits,storage_ix,storage);
    for (uVar13 = 0; uVar6 != uVar13; uVar13 = uVar13 + 1) {
      uVar5 = *(uint *)((long)p + uVar13 * 4);
      uVar12 = uVar5 & 0x1ff;
      bVar1 = depths[uVar12];
      if (bits[uVar12] >> (bVar1 & 0x3f) != 0) {
LAB_0011658c:
        __assertion = "(bits >> n_bits) == 0";
        uVar5 = 0x36;
LAB_001165bc:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                      ,uVar5,
                      "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
        ;
      }
      if (0x38 < bVar1) {
LAB_001165a5:
        __assertion = "n_bits <= 56";
        uVar5 = 0x37;
        goto LAB_001165bc;
      }
      uVar11 = *storage_ix;
      uVar9 = bVar1 + uVar11;
      *(ulong *)(storage + (uVar11 >> 3)) =
           (ulong)bits[uVar12] << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
      *storage_ix = uVar9;
      if (uVar12 - 1 < uVar8) {
        uVar5 = uVar5 >> 9;
        if (uVar5 >> ((byte)uVar12 & 0x3f) != 0) goto LAB_0011658c;
        if (0x38 < uVar12) goto LAB_001165a5;
        *(ulong *)(storage + (uVar9 >> 3)) =
             (ulong)uVar5 << ((byte)uVar9 & 7) | (ulong)storage[uVar9 >> 3];
        *storage_ix = uVar12 + uVar9;
      }
    }
    uVar6 = *storage_ix;
    *(ulong *)(storage + (uVar6 >> 3)) = (ulong)storage[uVar6 >> 3] | 1L << ((byte)uVar6 & 7);
    *storage_ix = uVar6 + 1;
    BrotliFree(m,p);
  }
  return;
code_r0x00116396:
  *(uint *)((long)p + uVar6 * 4) = ~(-1 << ((byte)uVar13 & 0x1f)) * 0x200 + uVar8;
  uVar12 = (uVar12 - uVar5) + 1;
  uVar6 = uVar6 + 1;
  goto LAB_0011638a;
}

Assistant:

static void EncodeContextMap(MemoryManager* m,
                             const uint32_t* context_map,
                             size_t context_map_size,
                             size_t num_clusters,
                             HuffmanTree* tree,
                             size_t* storage_ix, uint8_t* storage) {
  size_t i;
  uint32_t* rle_symbols;
  uint32_t max_run_length_prefix = 6;
  size_t num_rle_symbols = 0;
  uint32_t histogram[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];
  static const uint32_t kSymbolMask = (1u << SYMBOL_BITS) - 1u;
  uint8_t depths[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];
  uint16_t bits[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];

  StoreVarLenUint8(num_clusters - 1, storage_ix, storage);

  if (num_clusters == 1) {
    return;
  }

  rle_symbols = BROTLI_ALLOC(m, uint32_t, context_map_size);
  if (BROTLI_IS_OOM(m)) return;
  MoveToFrontTransform(context_map, context_map_size, rle_symbols);
  RunLengthCodeZeros(context_map_size, rle_symbols,
                     &num_rle_symbols, &max_run_length_prefix);
  memset(histogram, 0, sizeof(histogram));
  for (i = 0; i < num_rle_symbols; ++i) {
    ++histogram[rle_symbols[i] & kSymbolMask];
  }
  {
    BROTLI_BOOL use_rle = TO_BROTLI_BOOL(max_run_length_prefix > 0);
    BrotliWriteBits(1, (uint64_t)use_rle, storage_ix, storage);
    if (use_rle) {
      BrotliWriteBits(4, max_run_length_prefix - 1, storage_ix, storage);
    }
  }
  BuildAndStoreHuffmanTree(histogram, num_clusters + max_run_length_prefix,
                           tree, depths, bits, storage_ix, storage);
  for (i = 0; i < num_rle_symbols; ++i) {
    const uint32_t rle_symbol = rle_symbols[i] & kSymbolMask;
    const uint32_t extra_bits_val = rle_symbols[i] >> SYMBOL_BITS;
    BrotliWriteBits(depths[rle_symbol], bits[rle_symbol], storage_ix, storage);
    if (rle_symbol > 0 && rle_symbol <= max_run_length_prefix) {
      BrotliWriteBits(rle_symbol, extra_bits_val, storage_ix, storage);
    }
  }
  BrotliWriteBits(1, 1, storage_ix, storage);  /* use move-to-front */
  BROTLI_FREE(m, rle_symbols);
}